

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int mt_flush_queue(BGZF *fp)

{
  bgzf_mtaux_t *pbVar1;
  int iVar2;
  ssize_t sVar3;
  mtaux_t *mt;
  int i;
  BGZF *fp_local;
  
  pbVar1 = fp->mt;
  pthread_mutex_lock((pthread_mutex_t *)&pbVar1->lock);
  for (mt._4_4_ = 0; mt._4_4_ < pbVar1->n_threads; mt._4_4_ = mt._4_4_ + 1) {
    pbVar1->w[mt._4_4_].toproc = 1;
  }
  pbVar1->proc_cnt = 0;
  pthread_cond_broadcast((pthread_cond_t *)&pbVar1->cv);
  pthread_mutex_unlock((pthread_mutex_t *)&pbVar1->lock);
  worker_aux(pbVar1->w);
  do {
  } while (pbVar1->proc_cnt < pbVar1->n_threads);
  for (mt._4_4_ = 0; mt._4_4_ < pbVar1->n_threads; mt._4_4_ = mt._4_4_ + 1) {
    *(uint *)fp = *(uint *)fp & 0xffff0000 |
                  ((int)(short)*(undefined4 *)fp | pbVar1->w[mt._4_4_].errcode) & 0xffffU;
  }
  mt._4_4_ = 0;
  do {
    if (pbVar1->curr <= mt._4_4_) {
LAB_0014d0e7:
      pbVar1->curr = 0;
      iVar2 = -1;
      if ((short)*(undefined4 *)fp == 0) {
        iVar2 = 0;
      }
      return iVar2;
    }
    sVar3 = hwrite(fp->fp,pbVar1->blk[mt._4_4_],(long)pbVar1->len[mt._4_4_]);
    if (sVar3 != pbVar1->len[mt._4_4_]) {
      *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 4;
      goto LAB_0014d0e7;
    }
    mt._4_4_ = mt._4_4_ + 1;
  } while( true );
}

Assistant:

static int mt_flush_queue(BGZF *fp)
{
    int i;
    mtaux_t *mt = fp->mt;
    // signal all the workers to compress
    pthread_mutex_lock(&mt->lock);
    for (i = 0; i < mt->n_threads; ++i) mt->w[i].toproc = 1;
    mt->proc_cnt = 0;
    pthread_cond_broadcast(&mt->cv);
    pthread_mutex_unlock(&mt->lock);
    // worker 0 is doing things here
    worker_aux(&mt->w[0]);
    // wait for all the threads to complete
    while (mt->proc_cnt < mt->n_threads);
    // dump data to disk
    for (i = 0; i < mt->n_threads; ++i) fp->errcode |= mt->w[i].errcode;
    for (i = 0; i < mt->curr; ++i)
        if (hwrite(fp->fp, mt->blk[i], mt->len[i]) != mt->len[i]) {
            fp->errcode |= BGZF_ERR_IO;
            break;
        }
    mt->curr = 0;
    return (fp->errcode == 0)? 0 : -1;
}